

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

void Bac_ObjSetName(Bac_Ntk_t *p,int i,int x)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar4;
  
  if ((-1 < i) && (uVar1 = (p->vType).nSize, i < (int)uVar1)) {
    pcVar3 = (p->vType).pArray;
    bVar4 = pcVar3[(uint)i] & 0xfc;
    if (bVar4 == 4) {
      if (i < (p->vFanin).nSize) {
        uVar2 = (p->vFanin).pArray[(uint)i];
        if ((int)uVar2 < 0 || uVar1 <= uVar2) goto LAB_00329242;
        if ((pcVar3[uVar2] & 0xfcU) == 4) {
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if ((int)uVar2 < (p->vName).nSize) goto LAB_00329269;
      }
    }
    else if (i < (p->vName).nSize) {
      if ((bVar4 != 4) && ((p->vName).pArray[(uint)i] == 0)) {
        Vec_IntSetEntry(&p->vName,i,x);
        return;
      }
LAB_00329269:
      __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bac.h"
                    ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00329242:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void           Bac_ObjSetName( Bac_Ntk_t * p, int i, int x )   { assert(Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)); Vec_IntSetEntry( &p->vName, i, x );   }